

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall ExtPubkey_DerivePubkeyTest_Test::TestBody(ExtPubkey_DerivePubkeyTest_Test *this)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1ad0;
  Message local_1ac8;
  Extkey local_1ac0;
  string local_1a30;
  undefined1 local_1a10 [8];
  AssertionResult gtest_ar_39;
  Message local_19f8;
  string local_19f0;
  undefined1 local_19d0 [8];
  AssertionResult gtest_ar_38;
  KeyData data2;
  Message local_1830;
  Extkey local_1828;
  string local_1798;
  undefined1 local_1778 [8];
  AssertionResult gtest_ar_37;
  Message local_1760;
  string local_1758;
  undefined1 local_1738 [8];
  AssertionResult gtest_ar_36;
  string local_1720;
  undefined1 local_1700 [8];
  KeyData data1;
  Message local_1570 [2];
  CfdException *anon_var_0_1;
  string local_1558;
  ExtPubkey local_1538;
  byte local_14a1;
  char *pcStack_14a0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_1490;
  allocator local_1481;
  string local_1480;
  ExtPubkey local_1460;
  AssertHelper local_13d0;
  Message local_13c8 [2];
  CfdException *anon_var_0;
  string local_13b0;
  ExtPubkey local_1390;
  byte local_12f9;
  char *pcStack_12f8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_12e8;
  Pubkey local_12e0;
  string local_12c8;
  Pubkey local_12a8;
  string local_1290;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar_35;
  Message local_1258;
  uint8_t local_124a;
  uint8_t local_1249;
  undefined1 local_1248 [8];
  AssertionResult gtest_ar_34;
  Message local_1230;
  string local_1228;
  string local_1208;
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar_33;
  AssertHelper local_11b8;
  Message local_11b0;
  bool local_11a1;
  undefined1 local_11a0 [8];
  AssertionResult gtest_ar__4;
  Message local_1188;
  uint32_t local_1180;
  uint32_t local_117c;
  undefined1 local_1178 [8];
  AssertionResult gtest_ar_32;
  Message local_1160;
  ByteData local_1158;
  string local_1140;
  ByteData local_1120;
  string local_1108;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar_31;
  Message local_10d0;
  ByteData local_10c8;
  string local_10b0;
  ByteData local_1090;
  string local_1078;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar_30;
  Message local_1040;
  allocator local_1031;
  string local_1030;
  ExtPubkey local_1010;
  AssertHelper local_f80;
  Message local_f78;
  ByteData256 local_f70;
  string local_f58;
  ByteData256 local_f38;
  string local_f20;
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_29;
  Message local_ee8;
  Pubkey local_ee0;
  string local_ec8;
  Pubkey local_ea8;
  string local_e90;
  undefined1 local_e70 [8];
  AssertionResult gtest_ar_28;
  Message local_e58;
  uint8_t local_e4a;
  uint8_t local_e49;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar_27;
  Message local_e30;
  string local_e28;
  string local_e08;
  undefined1 local_de8 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_db8;
  Message local_db0;
  bool local_da1;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar__3;
  Message local_d88;
  uint32_t local_d80;
  uint32_t local_d7c;
  undefined1 local_d78 [8];
  AssertionResult gtest_ar_25;
  Message local_d60;
  ByteData local_d58;
  string local_d40;
  ByteData local_d20;
  string local_d08;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_24;
  Message local_cd0;
  ByteData local_cc8;
  string local_cb0;
  ByteData local_c90;
  string local_c78;
  undefined1 local_c58 [8];
  AssertionResult gtest_ar_23;
  Message local_c40;
  ByteData256 local_c38;
  string local_c20;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar_22;
  Message local_be8;
  ByteData local_be0;
  string local_bc8;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_21;
  Message local_b90;
  ByteData256 local_b88;
  string local_b70;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_20;
  Message local_b38;
  Pubkey local_b30;
  string local_b18;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar_19;
  Message local_ae0;
  uint8_t local_ad5;
  int local_ad4;
  undefined1 local_ad0 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_aa0;
  Message local_a98;
  bool local_a89;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar__2;
  Message local_a70;
  uint32_t local_a64;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_17;
  Message local_a48;
  ByteData local_a40;
  string local_a28;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_16;
  Message local_9f0;
  ExtPubkey local_9e8;
  AssertHelper local_958;
  Message local_950;
  ByteData256 local_948;
  string local_930;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_15;
  Message local_8f8;
  ByteData local_8f0;
  string local_8d8;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_14;
  Message local_8a0;
  ByteData256 local_898;
  string local_880;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_13;
  Message local_848;
  Pubkey local_840;
  string local_828;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_12;
  Message local_7f0;
  uint8_t local_7e5;
  int local_7e4;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_7b0;
  Message local_7a8;
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__1;
  Message local_780;
  uint32_t local_774;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_10;
  Message local_758;
  ByteData local_750;
  string local_738;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_9;
  Message local_700;
  ExtPubkey local_6f8;
  AssertHelper local_668;
  Message local_660;
  ByteData256 local_658;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_8;
  Message local_608;
  ByteData local_600;
  string local_5e8;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_7;
  Message local_5b0;
  ByteData256 local_5a8;
  string local_590;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_6;
  Message local_558;
  Pubkey local_550;
  string local_538;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_5;
  Message local_500;
  uint8_t local_4f5;
  int local_4f4;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_4c0;
  Message local_4b8;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_;
  Message local_490;
  uint32_t local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_3;
  Message local_468;
  ByteData local_460;
  string local_448;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_2;
  Message local_410;
  string local_408;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_1;
  Message local_3d0;
  ByteData local_3c8;
  string local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar;
  Message local_378 [2];
  ExtPubkey local_368;
  allocator<unsigned_int> local_2d1;
  uint local_2d0 [2];
  iterator local_2c8;
  size_type local_2c0;
  undefined1 local_2b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ExtPubkey child2;
  ExtPubkey child1;
  ExtPubkey child;
  undefined1 local_d8 [8];
  ExtPubkey extkey;
  allocator local_31;
  undefined1 local_30 [8];
  string ext_serial;
  ExtPubkey_DerivePubkeyTest_Test *this_local;
  
  ext_serial.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10),(string *)local_30);
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)local_d8,
             (ByteData *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             ((long)&child.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2d0[0] = 0;
  local_2d0[1] = 0x2c;
  local_2c8 = local_2d0;
  local_2c0 = 2;
  std::allocator<unsigned_int>::allocator(&local_2d1);
  __l._M_len = local_2c0;
  __l._M_array = local_2c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8,__l,&local_2d1);
  std::allocator<unsigned_int>::~allocator(&local_2d1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::DerivePubkey
                (&local_368,(ExtPubkey *)local_d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 ((long)&child1.super_Extkey.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 0x10),&local_368);
      cfd::core::ExtPubkey::~ExtPubkey(&local_368);
    }
  }
  else {
    testing::Message::Message(local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x6c,
               "Expected: (child = extkey.DerivePubkey(path)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_378);
  }
  cfd::core::Extkey::GetData
            (&local_3c8,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3b0,&local_3c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_390,
             "\"043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\""
             ,"child.GetData().GetHex().c_str()",
             "043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_3b0);
  cfd::core::ByteData::~ByteData(&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_408,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3e8,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"child.ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  cfd::core::Extkey::GetVersionData
            (&local_460,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_448,&local_460);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_428,"\"043587cf\"","child.GetVersionData().GetHex().c_str()",
             "043587cf",pcVar2);
  std::__cxx11::string::~string((string *)&local_448);
  cfd::core::ByteData::~ByteData(&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  local_484 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_480,"extpubkey_kVersionTestnetPubkey","child.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,&local_484);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4a9 = cfd::core::Extkey::IsValid
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_4a8,
               (AssertionResult *)"child.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  local_4f4 = 4;
  local_4f5 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_4f0,"4","child.GetDepth()",&local_4f4,&local_4f5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  cfd::core::Extkey::GetPubkey
            (&local_550,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_538,&local_550);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_518,
             "\"03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\"",
             "child.GetPubkey().GetHex().c_str()",
             "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",pcVar2);
  std::__cxx11::string::~string((string *)&local_538);
  cfd::core::Pubkey::~Pubkey(&local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  cfd::core::Extkey::GetChainCode
            (&local_5a8,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_590,&local_5a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_570,
             "\"839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e\"",
             "child.GetChainCode().GetHex().c_str()",
             "839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e",pcVar2);
  std::__cxx11::string::~string((string *)&local_590);
  cfd::core::ByteData256::~ByteData256(&local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_5b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  cfd::core::Extkey::GetFingerprintData
            (&local_600,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_5e8,&local_600);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5c8,"\"a53a8ff3\"","child.GetFingerprintData().GetHex().c_str()",
             "a53a8ff3",pcVar2);
  std::__cxx11::string::~string((string *)&local_5e8);
  cfd::core::ByteData::~ByteData(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  cfd::core::Extkey::GetPubTweakSum
            (&local_658,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_640,&local_658);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_620,
             "\"68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe\"",
             "child.GetPubTweakSum().GetHex().c_str()",
             "68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe",pcVar2);
  std::__cxx11::string::~string((string *)&local_640);
  cfd::core::ByteData256::~ByteData256(&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::DerivePubkey(&local_6f8,(ExtPubkey *)local_d8,0);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 ((long)&child2.super_Extkey.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 0x10),&local_6f8);
      cfd::core::ExtPubkey::~ExtPubkey(&local_6f8);
    }
  }
  else {
    testing::Message::Message(&local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7a,
               "Expected: (child1 = extkey.DerivePubkey(0)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_700);
  }
  cfd::core::Extkey::GetVersionData
            (&local_750,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_738,&local_750);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_718,"\"043587cf\"","child1.GetVersionData().GetHex().c_str()",
             "043587cf",pcVar2);
  std::__cxx11::string::~string((string *)&local_738);
  cfd::core::ByteData::~ByteData(&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_774 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_770,"extpubkey_kVersionTestnetPubkey","child1.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,&local_774);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  local_799 = cfd::core::Extkey::IsValid
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_798,
               (AssertionResult *)"child1.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_7e4 = 3;
  local_7e5 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child2.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_7e0,"3","child1.GetDepth()",&local_7e4,&local_7e5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  cfd::core::Extkey::GetPubkey
            (&local_840,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_828,&local_840);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_808,
             "\"02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3\"",
             "child1.GetPubkey().GetHex().c_str()",
             "02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3",pcVar2);
  std::__cxx11::string::~string((string *)&local_828);
  cfd::core::Pubkey::~Pubkey(&local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  cfd::core::Extkey::GetChainCode
            (&local_898,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_880,&local_898);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_860,
             "\"87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5\"",
             "child1.GetChainCode().GetHex().c_str()",
             "87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5",pcVar2);
  std::__cxx11::string::~string((string *)&local_880);
  cfd::core::ByteData256::~ByteData256(&local_898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_8a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  cfd::core::Extkey::GetFingerprintData
            (&local_8f0,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8d8,&local_8f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8b8,"\"b7665978\"","child1.GetFingerprintData().GetHex().c_str()",
             "b7665978",pcVar2);
  std::__cxx11::string::~string((string *)&local_8d8);
  cfd::core::ByteData::~ByteData(&local_8f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  cfd::core::Extkey::GetPubTweakSum
            (&local_948,
             (Extkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_930,&local_948);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_910,
             "\"6a5e09c61652134b024da66a8517fe2e280c6faaa7c3a99314f60b1081410f0c\"",
             "child1.GetPubTweakSum().GetHex().c_str()",
             "6a5e09c61652134b024da66a8517fe2e280c6faaa7c3a99314f60b1081410f0c",pcVar2);
  std::__cxx11::string::~string((string *)&local_930);
  cfd::core::ByteData256::~ByteData256(&local_948);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_950);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_958,&local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::DerivePubkey
                (&local_9e8,
                 (ExtPubkey *)
                 ((long)&child2.super_Extkey.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 0x10),0x2c);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_9e8);
      cfd::core::ExtPubkey::~ExtPubkey(&local_9e8);
    }
  }
  else {
    testing::Message::Message(&local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x86,
               "Expected: (child2 = child1.DerivePubkey(44)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_9f0);
  }
  cfd::core::Extkey::GetVersionData
            (&local_a40,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a28,&local_a40);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a08,"\"043587cf\"","child2.GetVersionData().GetHex().c_str()",
             "043587cf",pcVar2);
  std::__cxx11::string::~string((string *)&local_a28);
  cfd::core::ByteData::~ByteData(&local_a40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a64 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_a60,"extpubkey_kVersionTestnetPubkey","child2.GetVersion()",
             &extpubkey_kVersionTestnetPubkey,&local_a64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar1) {
    testing::Message::Message(&local_a70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  local_a89 = cfd::core::Extkey::IsValid
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a88,&local_a89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_a88,
               (AssertionResult *)"child2.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  local_ad4 = 4;
  local_ad5 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_char>
            ((EqHelper<false> *)local_ad0,"4","child2.GetDepth()",&local_ad4,&local_ad5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad0);
  if (!bVar1) {
    testing::Message::Message(&local_ae0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ad0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_ae0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_ae0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad0);
  cfd::core::Extkey::GetPubkey
            (&local_b30,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_b18,&local_b30);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_af8,
             "\"03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3\"",
             "child2.GetPubkey().GetHex().c_str()",
             "03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3",pcVar2);
  std::__cxx11::string::~string((string *)&local_b18);
  cfd::core::Pubkey::~Pubkey(&local_b30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af8);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_af8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
  cfd::core::Extkey::GetChainCode
            (&local_b88,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_b70,&local_b88);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b50,
             "\"839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e\"",
             "child2.GetChainCode().GetHex().c_str()",
             "839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e",pcVar2);
  std::__cxx11::string::~string((string *)&local_b70);
  cfd::core::ByteData256::~ByteData256(&local_b88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  cfd::core::Extkey::GetFingerprintData
            (&local_be0,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_bc8,&local_be0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ba8,"\"a53a8ff3\"","child2.GetFingerprintData().GetHex().c_str()",
             "a53a8ff3",pcVar2);
  std::__cxx11::string::~string((string *)&local_bc8);
  cfd::core::ByteData::~ByteData(&local_be0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar1) {
    testing::Message::Message(&local_be8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_be8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  cfd::core::Extkey::GetPubTweakSum
            (&local_c38,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_c20,&local_c38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c00,
             "\"68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe\"",
             "child2.GetPubTweakSum().GetHex().c_str()",
             "68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe",pcVar2);
  std::__cxx11::string::~string((string *)&local_c20);
  cfd::core::ByteData256::~ByteData256(&local_c38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_c40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  cfd::core::Extkey::GetData
            (&local_c90,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c78,&local_c90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetData
            (&local_cc8,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_cb0,&local_cc8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c58,"child2.GetData().GetHex().c_str()",
             "child.GetData().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_cb0);
  cfd::core::ByteData::~ByteData(&local_cc8);
  std::__cxx11::string::~string((string *)&local_c78);
  cfd::core::ByteData::~ByteData(&local_c90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c58);
  if (!bVar1) {
    testing::Message::Message(&local_cd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
  cfd::core::Extkey::GetVersionData
            (&local_d20,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d08,&local_d20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetVersionData
            (&local_d58,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d40,&local_d58);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ce8,"child2.GetVersionData().GetHex().c_str()",
             "child.GetVersionData().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_d40);
  cfd::core::ByteData::~ByteData(&local_d58);
  std::__cxx11::string::~string((string *)&local_d08);
  cfd::core::ByteData::~ByteData(&local_d20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar1) {
    testing::Message::Message(&local_d60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_d60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d7c = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_d80 = cfd::core::Extkey::GetVersion
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_d78,"child2.GetVersion()","child.GetVersion()",&local_d7c,
             &local_d80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar1) {
    testing::Message::Message(&local_d88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  local_da1 = cfd::core::Extkey::IsValid
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_da0,&local_da1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(&local_db0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_26.message_,(internal *)local_da0,
               (AssertionResult *)"child2.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_db8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_db8,&local_db0);
    testing::internal::AssertHelper::~AssertHelper(&local_db8);
    std::__cxx11::string::~string((string *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_e08,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_e28,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_de8,"child2.ToString().c_str()","child.ToString().c_str()",pcVar2,
             pcVar3);
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de8);
  if (!bVar1) {
    testing::Message::Message(&local_e30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_e30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_e30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de8);
  local_e49 = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_e4a = cfd::core::Extkey::GetDepth
                        ((Extkey *)
                         ((long)&child1.super_Extkey.tweak_sum_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_e48,"child2.GetDepth()","child.GetDepth()",&local_e49,
             &local_e4a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    testing::Message::Message(&local_e58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_e58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_e58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  cfd::core::Extkey::GetPubkey
            (&local_ea8,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_e90,&local_ea8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetPubkey
            (&local_ee0,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_ec8,&local_ee0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e70,"child2.GetPubkey().GetHex().c_str()",
             "child.GetPubkey().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_ec8);
  cfd::core::Pubkey::~Pubkey(&local_ee0);
  std::__cxx11::string::~string((string *)&local_e90);
  cfd::core::Pubkey::~Pubkey(&local_ea8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_ee8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  cfd::core::Extkey::GetPubTweakSum
            (&local_f38,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_f20,&local_f38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetPubTweakSum
            (&local_f70,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_f58,&local_f70);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f00,"child2.GetPubTweakSum().GetHex().c_str()",
             "child.GetPubTweakSum().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_f58);
  cfd::core::ByteData256::~ByteData256(&local_f70);
  std::__cxx11::string::~string((string *)&local_f20);
  cfd::core::ByteData256::~ByteData256(&local_f38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
  if (!bVar1) {
    testing::Message::Message(&local_f78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f00);
    testing::internal::AssertHelper::AssertHelper
              (&local_f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f80,&local_f78);
    testing::internal::AssertHelper::~AssertHelper(&local_f80);
    testing::Message::~Message(&local_f78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1030,"0x000000000/0x2c",&local_1031);
      cfd::core::ExtPubkey::DerivePubkey(&local_1010,(ExtPubkey *)local_d8,&local_1030);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1010);
      cfd::core::ExtPubkey::~ExtPubkey(&local_1010);
      std::__cxx11::string::~string((string *)&local_1030);
      std::allocator<char>::~allocator((allocator<char> *)&local_1031);
    }
  }
  else {
    testing::Message::Message(&local_1040);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x9d,
               "Expected: (child2 = extkey.DerivePubkey(\"0x000000000/0x2c\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_1040);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_1040);
  }
  cfd::core::Extkey::GetData
            (&local_1090,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1078,&local_1090);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetData
            (&local_10c8,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_10b0,&local_10c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1058,"child2.GetData().GetHex().c_str()",
             "child.GetData().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_10b0);
  cfd::core::ByteData::~ByteData(&local_10c8);
  std::__cxx11::string::~string((string *)&local_1078);
  cfd::core::ByteData::~ByteData(&local_1090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_10d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1058);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_10d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_10d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  cfd::core::Extkey::GetVersionData
            (&local_1120,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1108,&local_1120);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetVersionData
            (&local_1158,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1140,&local_1158);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10e8,"child2.GetVersionData().GetHex().c_str()",
             "child.GetVersionData().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_1140);
  cfd::core::ByteData::~ByteData(&local_1158);
  std::__cxx11::string::~string((string *)&local_1108);
  cfd::core::ByteData::~ByteData(&local_1120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar1) {
    testing::Message::Message(&local_1160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_1160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_1160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  local_117c = cfd::core::Extkey::GetVersion
                         ((Extkey *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1180 = cfd::core::Extkey::GetVersion
                         ((Extkey *)
                          ((long)&child1.super_Extkey.tweak_sum_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1178,"child2.GetVersion()","child.GetVersion()",&local_117c,
             &local_1180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1178);
  if (!bVar1) {
    testing::Message::Message(&local_1188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_1188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1178);
  local_11a1 = cfd::core::Extkey::IsValid
                         ((Extkey *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_11a0,&local_11a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a0);
  if (!bVar1) {
    testing::Message::Message(&local_11b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_33.message_,(internal *)local_11a0,
               (AssertionResult *)"child2.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_11b8,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    std::__cxx11::string::~string((string *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a0);
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_1208,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::ToString_abi_cxx11_
            (&local_1228,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11e8,"child2.ToString().c_str()","child.ToString().c_str()",pcVar2,
             pcVar3);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_1208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e8);
  if (!bVar1) {
    testing::Message::Message(&local_1230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_1230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_1230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e8);
  local_1249 = cfd::core::Extkey::GetDepth
                         ((Extkey *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_124a = cfd::core::Extkey::GetDepth
                         ((Extkey *)
                          ((long)&child1.super_Extkey.tweak_sum_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data + 0x10));
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_1248,"child2.GetDepth()","child.GetDepth()",&local_1249,
             &local_124a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1248);
  if (!bVar1) {
    testing::Message::Message(&local_1258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_1258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_1258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1248);
  cfd::core::Extkey::GetPubkey
            (&local_12a8,
             (Extkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1290,&local_12a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Extkey::GetPubkey
            (&local_12e0,
             (Extkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_12c8,&local_12e0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1270,"child2.GetPubkey().GetHex().c_str()",
             "child.GetPubkey().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_12c8);
  cfd::core::Pubkey::~Pubkey(&local_12e0);
  std::__cxx11::string::~string((string *)&local_1290);
  cfd::core::Pubkey::~Pubkey(&local_12a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1270);
  if (!bVar1) {
    testing::Message::Message(&local_12e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_12e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_12e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1270);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffed08,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffed08);
  if (bVar1) {
    local_12f9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_13b0,"m/1/1",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ExtPubkey::DerivePubkey(&local_1390,(ExtPubkey *)local_d8,&local_13b0);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1390);
      cfd::core::ExtPubkey::~ExtPubkey(&local_1390);
      std::__cxx11::string::~string((string *)&local_13b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_12f9 & 1) == 0) {
      pcStack_12f8 = 
      "Expected: (child2 = extkey.DerivePubkey(\"m/1/1\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002fe4f2;
    }
  }
  else {
LAB_002fe4f2:
    testing::Message::Message(local_13c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa6,pcStack_12f8);
    testing::internal::AssertHelper::operator=(&local_13d0,local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    testing::Message::~Message(local_13c8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1480,"/1/1",&local_1481);
      cfd::core::ExtPubkey::DerivePubkey(&local_1460,(ExtPubkey *)local_d8,&local_1480);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1460);
      cfd::core::ExtPubkey::~ExtPubkey(&local_1460);
      std::__cxx11::string::~string((string *)&local_1480);
      std::allocator<char>::~allocator((allocator<char> *)&local_1481);
    }
  }
  else {
    testing::Message::Message(&local_1490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xa8,
               "Expected: (child2 = extkey.DerivePubkey(\"/1/1\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_1490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_1490);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffeb60,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffeb60);
  if (bVar1) {
    local_14a1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1558,"1/2//3",(allocator *)((long)&anon_var_0_1 + 7));
      cfd::core::ExtPubkey::DerivePubkey(&local_1538,(ExtPubkey *)local_d8,&local_1558);
      cfd::core::ExtPubkey::operator=
                ((ExtPubkey *)
                 &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1538);
      cfd::core::ExtPubkey::~ExtPubkey(&local_1538);
      std::__cxx11::string::~string((string *)&local_1558);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
    }
    if ((local_14a1 & 1) != 0) goto LAB_002fe9b3;
    pcStack_14a0 = 
    "Expected: (child2 = extkey.DerivePubkey(\"1/2//3\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1570);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
             ,0xaa,pcStack_14a0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_1570);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &data1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::Message::~Message(local_1570);
LAB_002fe9b3:
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1720,"0/44",(allocator *)((long)&gtest_ar_36.message_.ptr_ + 7));
  cfd::core::ExtPubkey::DerivePubkeyData((KeyData *)local_1700,(ExtPubkey *)local_d8,&local_1720);
  std::__cxx11::string::~string((string *)&local_1720);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_36.message_.ptr_ + 7));
  cfd::core::KeyData::ToString_abi_cxx11_(&local_1758,(KeyData *)local_1700,false,kApostrophe,false)
  ;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1738,
             "\"[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"data1.ToString(false).c_str()",
             "[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1738);
  if (!bVar1) {
    testing::Message::Message(&local_1760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_1760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_1760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1738);
  cfd::core::KeyData::GetExtPubkey((ExtPubkey *)&local_1828,(KeyData *)local_1700);
  cfd::core::Extkey::ToString_abi_cxx11_(&local_1798,&local_1828);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1778,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"data1.GetExtPubkey().ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1798);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_1828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1778);
  if (!bVar1) {
    testing::Message::Message(&local_1830);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1830);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &data2.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1778);
  cfd::core::ExtPubkey::DerivePubkeyData
            ((KeyData *)&gtest_ar_38.message_,(ExtPubkey *)local_d8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_19f0,(KeyData *)&gtest_ar_38.message_,false,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_19d0,
             "\"[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"data2.ToString(false).c_str()",
             "[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_19f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d0);
  if (!bVar1) {
    testing::Message::Message(&local_19f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_19d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_19f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_19f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d0);
  cfd::core::KeyData::GetExtPubkey((ExtPubkey *)&local_1ac0,(KeyData *)&gtest_ar_38.message_);
  cfd::core::Extkey::ToString_abi_cxx11_(&local_1a30,&local_1ac0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1a10,
             "\"tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua\""
             ,"data2.GetExtPubkey().ToString().c_str()",
             "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_1a30);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_1ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a10);
  if (!bVar1) {
    testing::Message::Message(&local_1ac8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a10);
    testing::internal::AssertHelper::AssertHelper
              (&local_1ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ad0,&local_1ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ad0);
    testing::Message::~Message(&local_1ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a10);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_38.message_);
  cfd::core::KeyData::~KeyData((KeyData *)local_1700);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8);
  cfd::core::ExtPubkey::~ExtPubkey
            ((ExtPubkey *)
             &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ExtPubkey::~ExtPubkey
            ((ExtPubkey *)
             ((long)&child2.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPubkey::~ExtPubkey
            ((ExtPubkey *)
             ((long)&child1.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_d8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ExtPubkey, DerivePubkeyTest) {
  std::string ext_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  ExtPubkey extkey = ExtPubkey(ByteData(ext_serial));
  ExtPubkey child;
  ExtPubkey child1;
  ExtPubkey child2;
  std::vector<uint32_t> path = {0, 44};

  EXPECT_NO_THROW((child = extkey.DerivePubkey(path)));
  EXPECT_STREQ("043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child.GetData().GetHex().c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", child.ToString().c_str());
  EXPECT_STREQ("043587cf", child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child.GetVersion());
  EXPECT_TRUE(child.IsValid());
  EXPECT_EQ(4, child.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", child.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", child.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe", child.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child1 = extkey.DerivePubkey(0)));
  EXPECT_STREQ("043587cf", child1.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child1.GetVersion());
  EXPECT_TRUE(child1.IsValid());
  EXPECT_EQ(3, child1.GetDepth());
  EXPECT_STREQ("02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3", child1.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5", child1.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("b7665978", child1.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("6a5e09c61652134b024da66a8517fe2e280c6faaa7c3a99314f60b1081410f0c", child1.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child2 = child1.DerivePubkey(44)));
  EXPECT_STREQ("043587cf", child2.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child2.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(4, child2.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child2.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", child2.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", child2.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe", child2.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.GetVersionData().GetHex().c_str(), child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_STREQ(child2.GetPubkey().GetHex().c_str(), child.GetPubkey().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ(child2.GetPubTweakSum().GetHex().c_str(), child.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child2 = extkey.DerivePubkey("0x000000000/0x2c")));  // 0/44
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.GetVersionData().GetHex().c_str(), child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_STREQ(child2.GetPubkey().GetHex().c_str(), child.GetPubkey().GetHex().c_str());

  EXPECT_THROW((child2 = extkey.DerivePubkey("m/1/1")), CfdException);  // master 

  EXPECT_NO_THROW((child2 = extkey.DerivePubkey("/1/1")));  // start slash

  EXPECT_THROW((child2 = extkey.DerivePubkey("1/2//3")), CfdException);  // empty number

  // KeyData
  KeyData data1 = extkey.DerivePubkeyData("0/44");
  EXPECT_STREQ("[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data1.ToString(false).c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data1.GetExtPubkey().ToString().c_str());

  KeyData data2 = extkey.DerivePubkeyData(path);
  EXPECT_STREQ("[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data2.ToString(false).c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data2.GetExtPubkey().ToString().c_str());
}